

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O0

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Invoke
               (BenchmarkContext *context,int64_t numSlots)

{
  int64_t iVar1;
  __sighandler_t __handler;
  int __sig;
  long local_b8;
  int64_t i;
  string local_a8 [32];
  undefined1 local_88 [8];
  IOperationProfilerPtr op;
  undefined1 local_68 [8];
  StorageArray<wigwag::token> c;
  undefined1 local_48 [8];
  SignalType s;
  HandlerType handler;
  int64_t n;
  int64_t numSlots_local;
  BenchmarkContext *context_local;
  
  iVar1 = BenchmarkContext::GetIterationsCount(context);
  descriptors::signal::wigwag::Ui::MakeHandler();
  wigwag::
  signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
  ::signal<,true,void>
            ((signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
              *)local_48);
  StorageArray<wigwag::token>::StorageArray((StorageArray<wigwag::token> *)local_68,numSlots);
  op.super___shared_ptr<benchmarks::IOperationProfiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  StorageArray<wigwag::token>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Invoke(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            ((StorageArray<wigwag::token> *)local_68,
             (anon_class_16_2_8e986c60 *)
             &op.super___shared_ptr<benchmarks::IOperationProfiler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"invoke",(allocator *)((long)&i + 7));
  (*context->_vptr_BenchmarkContext[3])(local_88,context,local_a8,numSlots * iVar1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  for (local_b8 = 0; __sig = (int)context, local_b8 < iVar1; local_b8 = local_b8 + 1) {
    wigwag::
    signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
    ::operator()((signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
                  *)local_48);
  }
  std::shared_ptr<benchmarks::IOperationProfiler>::~shared_ptr
            ((shared_ptr<benchmarks::IOperationProfiler> *)local_88);
  StorageArray<wigwag::token>::Destruct((StorageArray<wigwag::token> *)local_68);
  StorageArray<wigwag::token>::~StorageArray((StorageArray<wigwag::token> *)local_68);
  wigwag::
  signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
  ::~signal((signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
             *)local_48,__sig,__handler);
  std::function<void_()>::~function((function<void_()> *)&s);
  return;
}

Assistant:

static void Invoke(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(numSlots);

            c.Construct([&]{ return s.connect(handler); });

            {
                auto op = context.Profile("invoke", numSlots * n);
                for (int64_t i = 0; i < n; ++i)
                    s();
            }

            c.Destruct();
        }